

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O3

Am_Object find_palette_for_command
                    (Am_Object *main_cmd,Am_Value *current_value,Am_Object *script_window)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Object *in_RCX;
  Am_Am_Slot_Key slot;
  Am_Object undo_handler;
  Am_Object undo_db;
  Am_Am_Slot_Key local_52;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value local_40;
  
  pAVar2 = Am_Object::Get((Am_Object *)current_value,0x19c,1);
  local_52.value = 0;
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    Am_Am_Slot_Key::operator=(&local_52,pAVar2);
  }
  else {
    local_52.value = 0;
  }
  Am_Object::Get_Object(&local_48,(Am_Slot_Key)in_RCX,(ulong)Am_UNDO_MENU_OF_COMMANDS);
  pAVar2 = Am_Object::Get(&local_48,Am_UNDO_HANDLER_TO_DISPLAY,0);
  Am_Object::Am_Object(&local_50,pAVar2);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"searching for palette for undo ",0x1f);
    poVar3 = operator<<((ostream *)&std::cout,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," from ",6);
    poVar3 = operator<<(poVar3,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," from ",6);
    poVar3 = operator<<(poVar3,in_RCX);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," slot ",6);
    poVar3 = operator<<(poVar3,&local_52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," value ",7);
    poVar3 = operator<<(poVar3,(Am_Value *)script_window);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ostream::flush();
  }
  pAVar2 = (Am_Value *)(ulong)local_52.value;
  Am_Value::Am_Value(&local_40,(Am_Value *)script_window);
  Am_Find_Palette_For(main_cmd,(Am_Am_Slot_Key)(Am_Slot_Key)&local_50,pAVar2);
  Am_Value::~Am_Value(&local_40);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  found  ",9);
    poVar3 = operator<<((ostream *)&std::cout,main_cmd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ostream::flush();
  }
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_48);
  return (Am_Object)(Am_Object_Data *)main_cmd;
}

Assistant:

Am_Object
find_palette_for_command(Am_Object &main_cmd, Am_Value &current_value,
                         Am_Object &script_window)
{
  const Am_Value& slot_key_value = main_cmd.Peek(Am_SLOT_FOR_VALUE);
  Am_Am_Slot_Key slot;
  if (!slot_key_value.Valid())
    slot = 0;
  else
    slot = slot_key_value;
  Am_Object undo_db = script_window.Get_Object(Am_UNDO_MENU_OF_COMMANDS);
  Am_Object undo_handler = undo_db.Get(Am_UNDO_HANDLER_TO_DISPLAY);
  if (am_sdebug)
    std::cout << "searching for palette for undo " << undo_handler << " from "
              << undo_db << " from " << script_window << " slot " << slot
              << " value " << current_value << std::endl
              << std::flush;
  Am_Object palette = Am_Find_Palette_For(undo_handler, slot, current_value);
  if (am_sdebug)
    std::cout << "  found  " << palette << std::endl << std::flush;
  return palette;
}